

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  constraint_t<int> *pcVar1;
  bool bVar2;
  int iVar3;
  exception_t<cfgfile::string_trait_t> *peVar4;
  allocator<char> local_2d4;
  allocator<char> local_2d3;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  int value;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  allocator<char> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined != false) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"Value for the tag \"",local_a8);
    std::__cxx11::string::string((string *)&local_1c8,(string *)&local_1e8);
    std::operator+(&local_1a8,&local_1c8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,"\" already defined. In file \"",(allocator<char> *)&local_c8);
    std::__cxx11::string::string((string *)&local_208,local_228);
    std::operator+(&local_188,&local_1a8,&local_208);
    std::operator+(&local_168,&local_188,&info->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>
              (local_268,"\" on line ",(allocator<char> *)&local_e8);
    std::__cxx11::string::string((string *)&local_248,local_268);
    std::operator+(&local_148,&local_168,&local_248);
    std::__cxx11::to_string(&local_288,info->m_line_number);
    std::operator+(&local_128,&local_148,&local_288);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,".",local_108);
    std::__cxx11::string::string((string *)&local_2a8,(string *)&local_2c8);
    std::operator+(&local_88,&local_128,&local_2a8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_88);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_any_child_defined
                    (&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,"Value \"",(allocator<char> *)&value);
    std::__cxx11::string::string((string *)&local_208,local_228);
    std::operator+(&local_1e8,&local_208,str);
    std::__cxx11::string::string<std::allocator<char>>(local_268,"\" for tag \"",&local_2d1);
    std::__cxx11::string::string((string *)&local_248,local_268);
    std::operator+(&local_1c8,&local_1e8,&local_248);
    std::operator+(&local_1a8,&local_1c8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"\" must be defined before any child tag. In file \"",&local_2d2
              );
    std::__cxx11::string::string((string *)&local_288,(string *)&local_2a8);
    std::operator+(&local_188,&local_1a8,&local_288);
    std::operator+(&local_168,&local_188,&info->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"\" on line ",&local_2d3);
    std::__cxx11::string::string((string *)&local_2c8,(string *)local_a8);
    std::operator+(&local_148,&local_168,&local_2c8);
    std::__cxx11::to_string(&local_c8,info->m_line_number);
    std::operator+(&local_128,&local_148,&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,".",&local_2d4);
    std::__cxx11::string::string((string *)&local_e8,(string *)local_108);
    std::operator+(&local_48,&local_128,&local_e8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_48);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  value = format_t<int,_cfgfile::string_trait_t>::from_string(info,str);
  pcVar1 = this->m_constraint;
  if ((pcVar1 != (constraint_t<int> *)0x0) &&
     (iVar3 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&value), (char)iVar3 == '\0')) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>(local_228,"Invalid value: \"",&local_2d1);
    std::__cxx11::string::string((string *)&local_208,local_228);
    std::operator+(&local_1e8,&local_208,str);
    std::__cxx11::string::string<std::allocator<char>>
              (local_268,"\". Value must match to the constraint in tag \"",&local_2d2);
    std::__cxx11::string::string((string *)&local_248,local_268);
    std::operator+(&local_1c8,&local_1e8,&local_248);
    std::operator+(&local_1a8,&local_1c8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"\". In file \"",&local_2d3);
    std::__cxx11::string::string((string *)&local_288,(string *)&local_2a8);
    std::operator+(&local_188,&local_1a8,&local_288);
    std::operator+(&local_168,&local_188,&info->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"\" on line ",&local_2d4);
    std::__cxx11::string::string((string *)&local_2c8,(string *)local_a8);
    std::operator+(&local_148,&local_168,&local_2c8);
    std::__cxx11::to_string(&local_c8,info->m_line_number);
    std::operator+(&local_128,&local_148,&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,".",&local_2c9);
    std::__cxx11::string::string((string *)&local_e8,(string *)local_108);
    std::operator+(&local_68,&local_128,&local_e8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_68);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  this->m_value = value;
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any "
						"child tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			T value = format_t< T, Trait >::from_string( info, str );

			if( m_constraint )
			{
				if( !m_constraint->check( value ) )
					throw exception_t< Trait >(
						Trait::from_ascii( "Invalid value: \"" ) +
						str +
						Trait::from_ascii( "\". Value must match to the "
							"constraint in tag \"" ) +
						this->name() + Trait::from_ascii( "\". In file \"" ) +
						info.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( info.line_number() ) +
						Trait::from_ascii( "." ) );
			}

			m_value = value;

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}